

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void Assimp::ExportSceneObj
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  _Alloc_hider _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 extraout_var_00;
  DeadlyImportError *pDVar5;
  allocator<char> local_4c1;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  ObjExporter exporter;
  long *plVar3;
  
  ObjExporter::ObjExporter(&exporter,pFile,pScene,false);
  if ((((&exporter.field_0x20)[*(long *)(exporter._0_8_ + -0x18)] & 5) != 0) ||
     (((&exporter.field_0x198)[*(long *)(exporter._376_8_ + -0x18)] & 5) != 0)) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,pFile,&local_4c1);
    std::operator+(&local_4c0,"output data creation failed. Most likely the file became too large: "
                   ,&local_4a0);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_4c0);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 == (long *)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,pFile,&local_4c1);
    std::operator+(&local_4c0,"could not open output .obj file: ",&local_4a0);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_4c0);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringbuf::str();
  _Var1._M_p = local_4c0._M_dataplus._M_p;
  uVar4 = std::ostream::tellp();
  (**(code **)(*plVar3 + 0x18))(plVar3,_Var1._M_p,uVar4,1);
  std::__cxx11::string::~string((string *)&local_4c0);
  (**(code **)(*plVar3 + 8))(plVar3);
  ObjExporter::GetMaterialLibFileName_abi_cxx11_(&local_4c0,&exporter);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"wt",&local_4c1);
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])
                    (pIOSystem,local_4c0._M_dataplus._M_p,local_4a0._M_dataplus._M_p);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  if (plVar3 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    uVar4 = std::ostream::tellp();
    (**(code **)(*plVar3 + 0x18))(plVar3,local_4c0._M_dataplus._M_p,uVar4,1);
    std::__cxx11::string::~string((string *)&local_4c0);
    (**(code **)(*plVar3 + 8))(plVar3);
    ObjExporter::~ObjExporter(&exporter);
    return;
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  ObjExporter::GetMaterialLibFileName_abi_cxx11_(&local_4a0,&exporter);
  std::operator+(&local_4c0,"could not open output .mtl file: ",&local_4a0);
  DeadlyImportError::DeadlyImportError(pDVar5,&local_4c0);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneObj(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/) {
    // invoke the exporter
    ObjExporter exporter(pFile, pScene);

    if (exporter.mOutput.fail() || exporter.mOutputMat.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write both the main OBJ file and the material script
    {
        std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
        if(outfile == NULL) {
            throw DeadlyExportError("could not open output .obj file: " + std::string(pFile));
        }
        outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
    }
    {
        std::unique_ptr<IOStream> outfile (pIOSystem->Open(exporter.GetMaterialLibFileName(),"wt"));
        if(outfile == NULL) {
            throw DeadlyExportError("could not open output .mtl file: " + std::string(exporter.GetMaterialLibFileName()));
        }
        outfile->Write( exporter.mOutputMat.str().c_str(), static_cast<size_t>(exporter.mOutputMat.tellp()),1);
    }
}